

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O0

void Fl::set_color(Fl_Color i,uint c)

{
  uint c_local;
  Fl_Color i_local;
  
  if (fl_cmap[i] != c) {
    free_color(i,0);
    fl_cmap[i] = c;
  }
  return;
}

Assistant:

void Fl::set_color(Fl_Color i, unsigned c) {
  if (fl_cmap[i] != c) {
    free_color(i,0);
#  if HAVE_OVERLAY
    free_color(i,1);
#  endif
    fl_cmap[i] = c;
  }
}